

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_knot.cpp
# Opt level: O3

bool ON_ClampKnotVector(int cv_dim,int order,int cv_count,int cv_stride,double *cv,double *knot,
                       int end)

{
  uint uVar1;
  double dVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  bool bVar5;
  ulong uVar6;
  long lVar7;
  double *knots;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar11 [16];
  long lVar10;
  
  if ((((1 < order) && (cv != (double *)0x0)) && (knot != (double *)0x0)) &&
     ((uint)end < 3 && order <= cv_count)) {
    bVar4 = true;
    if ((end & 1U) == 0) {
      uVar6 = (ulong)(order - 2);
      bVar4 = ON_EvaluateNurbsDeBoor(cv_dim,order,cv_stride,cv,knot,1,0.0,knot[uVar6]);
      auVar3 = _DAT_0069b120;
      if (2 < (uint)order && bVar4) {
        dVar2 = knot[uVar6];
        lVar7 = uVar6 - 1;
        auVar8._8_4_ = (int)lVar7;
        auVar8._0_8_ = lVar7;
        auVar8._12_4_ = (int)((ulong)lVar7 >> 0x20);
        lVar7 = 0;
        auVar8 = auVar8 ^ _DAT_0069b120;
        auVar9 = _DAT_0069b170;
        do {
          auVar11 = auVar9 ^ auVar3;
          if ((bool)(~(auVar11._4_4_ == auVar8._4_4_ && auVar8._0_4_ < auVar11._0_4_ ||
                      auVar8._4_4_ < auVar11._4_4_) & 1)) {
            *(double *)((long)knot + lVar7) = dVar2;
          }
          if ((auVar11._12_4_ != auVar8._12_4_ || auVar11._8_4_ <= auVar8._8_4_) &&
              auVar11._12_4_ <= auVar8._12_4_) {
            *(double *)((long)knot + lVar7 + 8) = dVar2;
          }
          lVar10 = auVar9._8_8_;
          auVar9._0_8_ = auVar9._0_8_ + 2;
          auVar9._8_8_ = lVar10 + 2;
          lVar7 = lVar7 + 0x10;
        } while ((ulong)(order - 1U >> 1) << 4 != lVar7);
      }
      if (1 < end - 1U) {
        return bVar4;
      }
    }
    knots = knot + (cv_count - order);
    bVar5 = ON_EvaluateNurbsDeBoor
                      (cv_dim,order,cv_stride,cv + (cv_count - order) * cv_stride,knots,-1,0.0,
                       knots[(ulong)(uint)order - 1]);
    if (bVar5) {
      uVar1 = order * 2 - 3;
      if (order <= (int)uVar1) {
        dVar2 = knots[(ulong)(uint)order - 1];
        do {
          knots[uVar1] = dVar2;
          bVar5 = order < (int)uVar1;
          uVar1 = uVar1 - 1;
        } while (bVar5);
        return bVar4;
      }
      return bVar4;
    }
  }
  return false;
}

Assistant:

bool ON_ClampKnotVector(
        int cv_dim,   // dimension of cv's = ( = dim+1 for rational cvs )
        int order, 
        int cv_count,
        int cv_stride, 
        double* cv,   // nullptr or cv array with room for at least knot_multiplicity new cvs
        double* knot, // knot array with room for at least knot_multiplicity new knots
        int end       // 0 = clamp start, 1 = clamp end, 2 = clamp both ends
        )
{
  // sets initial/final order-2 knot values to match knot[order-2]/knot[cv_count-1]
  // Adjusts initial/final order many CVs so that the curve location is unchanged. 
  // Requires that knot[order-2]< knot[order-1] and/or knot[cv_count-2] < knot[cv_count-1] 
  // 17-June-2020 Improved error reporting.  
 bool rc = false;
  int i, i0;

  if (cv && knot && order >= 2 && cv_count >= order && end>=0 && end<=2 ) {
    rc = true;
    if ( end == 0 || end == 2 ) { 
      if (ON_EvaluateNurbsDeBoor(cv_dim, order, cv_stride, cv, knot, 1, 0.0, knot[order - 2]))
      {
        for (i = 0; i < order - 2; i++)
          knot[i] = knot[order - 2];
      }
      else
        rc = false;
    }
    if ( end == 1 || end == 2 ) {
      i0 = cv_count-order;
      knot += i0;
      cv += i0*cv_stride;
      if (ON_EvaluateNurbsDeBoor(cv_dim, order, cv_stride, cv, knot, -1, 0.0, knot[order - 1]))
      {
        i0 = order - 1;
        for (i = 2 * order - 3; i > i0; i--)
          knot[i] = knot[i0];
      }
      else
        rc = false;
    }
  }
  return rc;
}